

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

int glu::TextureTestUtil::computeTextureLookupDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,TextureCubeView *baseView,float *texCoord,
              ReferenceParams *sampleParams,LookupPrecision *lookupPrec,LodPrecision *lodPrec,
              qpWatchDog *watchDog)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int y_;
  float *pfVar6;
  float width;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float z_;
  float fVar16;
  float local_384;
  float local_350;
  Vec4 local_334;
  Vector<float,_2> local_324;
  Vec2 local_31c;
  Vec2 local_314;
  Vec2 clampedLod;
  Vec2 lodO;
  Vec3 coordDyo;
  Vec3 coordDxo;
  Vec3 coordO;
  float nyo;
  float nxo;
  float wyo;
  float wxo;
  int lodOffsNdx;
  Vec2 lodBounds;
  Vec3 coordDy;
  Vec3 coordDx;
  Vec3 coord;
  float triNy;
  float triNx;
  float triWy;
  float triWx;
  int triNdx;
  bool isOk;
  bool tri1;
  bool tri0;
  float ny;
  float nx;
  float wy;
  float wx;
  Vector<float,_4> local_268;
  Vector<bool,_4> local_258;
  undefined1 local_254 [16];
  Vector<float,_4> local_244;
  undefined1 local_234 [8];
  Vec4 refPix;
  Vector<float,_4> local_214;
  undefined1 local_204 [8];
  Vec4 resPix;
  int px;
  int py;
  Vector<float,_2> local_1d8;
  Vec2 lodOffsets [8];
  int numFailed;
  float posEps;
  Vec2 lodBias;
  Vec3 triW [2];
  undefined1 local_168 [8];
  Vec3 triR [2];
  undefined1 local_148 [8];
  Vec3 triT [2];
  undefined1 local_128 [8];
  Vec3 triS [2];
  int srcSize;
  float dstH;
  float dstW;
  IVec2 dstSize;
  Vec4 rq;
  Vec4 tq;
  Vec4 sq;
  TextureCubeView local_c0;
  undefined1 local_88 [8];
  TextureCubeView src;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  ReferenceParams *sampleParams_local;
  float *texCoord_local;
  TextureCubeView *baseView_local;
  PixelBufferAccess *errorMask_local;
  ConstPixelBufferAccess *reference_local;
  ConstPixelBufferAccess *result_local;
  
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::vector
            ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             (src.m_levels + 5));
  getSubView(&local_c0,baseView,sampleParams->baseLevel,sampleParams->maxLevel);
  tcu::getEffectiveTextureView
            ((TextureCubeView *)local_88,&local_c0,
             (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             (src.m_levels + 5),&sampleParams->sampler);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(tq.m_data + 2),*texCoord,texCoord[3],texCoord[6],texCoord[9]);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(rq.m_data + 2),texCoord[1],texCoord[4],texCoord[7],texCoord[10]);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)&dstSize,texCoord[2],texCoord[5],texCoord[8],texCoord[0xb]);
  iVar5 = tcu::ConstPixelBufferAccess::getWidth(result);
  y_ = tcu::ConstPixelBufferAccess::getHeight(result);
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&dstH,iVar5,y_);
  iVar5 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&dstH);
  width = (float)iVar5;
  iVar5 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&dstH);
  triS[1].m_data[2] = (float)iVar5;
  triS[1].m_data[1] = (float)tcu::TextureCubeView::getSize((TextureCubeView *)local_88);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_128,(int)&tq + 8,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triS[0].m_data + 1),(int)&tq + 8,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_148,(int)&rq + 8,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triT[0].m_data + 1),(int)&rq + 8,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_168,(int)&dstSize,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triR[0].m_data + 1),(int)&dstSize,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)&lodBias,(int)sampleParams + 0xc,0,1);
  tcu::Vector<float,_4>::swizzle
            ((Vector<float,_4> *)(triW[0].m_data + 1),(int)sampleParams + 0xc,3,2);
  if (((sampleParams->super_RenderParams).flags & 2) == 0) {
    local_350 = 0.0;
  }
  else {
    local_350 = (sampleParams->super_RenderParams).bias;
  }
  tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&numFailed,local_350);
  lodOffsets[7].m_data[1] = 0.0625;
  lodOffsets[7].m_data[0] = 0.0;
  tcu::Vector<float,_2>::Vector(&local_1d8,-1.0,0.0);
  tcu::Vector<float,_2>::Vector(lodOffsets,1.0,0.0);
  tcu::Vector<float,_2>::Vector(lodOffsets + 1,0.0,-1.0);
  tcu::Vector<float,_2>::Vector(lodOffsets + 2,0.0,1.0);
  tcu::Vector<float,_2>::Vector(lodOffsets + 3,-1.0,-1.0);
  tcu::Vector<float,_2>::Vector(lodOffsets + 4,-1.0,1.0);
  tcu::Vector<float,_2>::Vector(lodOffsets + 5,1.0,-1.0);
  tcu::Vector<float,_2>::Vector(lodOffsets + 6,1.0,1.0);
  tcu::RGBA::green();
  tcu::RGBA::toVec((RGBA *)&py);
  tcu::clear(errorMask,(Vec4 *)&py);
  resPix.m_data[3] = 0.0;
  do {
    fVar7 = resPix.m_data[3];
    iVar5 = tcu::ConstPixelBufferAccess::getHeight(result);
    fVar8 = lodOffsets[7].m_data[0];
    if (iVar5 <= (int)fVar7) {
      std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
      ~vector((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
              (src.m_levels + 5));
      return (int)fVar8;
    }
    if (watchDog != (qpWatchDog *)0x0) {
      qpWatchDog_touch(watchDog);
    }
    for (resPix.m_data[2] = 0.0; fVar7 = resPix.m_data[2],
        iVar5 = tcu::ConstPixelBufferAccess::getWidth(result), (int)fVar7 < iVar5;
        resPix.m_data[2] = (float)((int)resPix.m_data[2] + 1)) {
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)(refPix.m_data + 2),(int)result,(int)resPix.m_data[2],
                 (int)resPix.m_data[3]);
      tcu::operator-((tcu *)&local_214,(Vector<float,_4> *)(refPix.m_data + 2),
                     &(sampleParams->super_RenderParams).colorBias);
      tcu::operator/((tcu *)local_204,&local_214,&(sampleParams->super_RenderParams).colorScale);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_254,(int)reference,(int)resPix.m_data[2],
                 (int)resPix.m_data[3]);
      tcu::operator-((tcu *)&local_244,(Vector<float,_4> *)local_254,
                     &(sampleParams->super_RenderParams).colorBias);
      tcu::operator/((tcu *)local_234,&local_244,&(sampleParams->super_RenderParams).colorScale);
      tcu::operator-((tcu *)&wy,(Vector<float,_4> *)local_204,(Vector<float,_4> *)local_234);
      tcu::abs<float,4>((tcu *)&local_268,(Vector<float,_4> *)&wy);
      tcu::lessThanEqual<float,4>((tcu *)&local_258,&local_268,&lookupPrec->colorThreshold);
      bVar3 = tcu::boolAll<4>(&local_258);
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        fVar7 = (float)(int)resPix.m_data[2] + 0.5;
        fVar8 = (float)(int)resPix.m_data[3] + 0.5;
        fVar9 = fVar8 / triS[1].m_data[2];
        fVar16 = (fVar8 + 0.0625) / triS[1].m_data[2];
        bVar3 = false;
        for (triWy = (float)(uint)(1.0 < (fVar7 - 0.0625) / width +
                                         (fVar8 - 0.0625) / triS[1].m_data[2]);
            (int)triWy <= (int)(uint)(1.0 <= (fVar7 + 0.0625) / width + fVar16);
            triWy = (float)((int)triWy + 1)) {
          local_384 = fVar9;
          fVar1 = fVar8;
          fVar2 = fVar7;
          fVar13 = fVar7 / width;
          if (triWy != 0.0) {
            local_384 = 1.0 - fVar9;
            fVar1 = triS[1].m_data[2] - fVar8;
            fVar2 = width - fVar7;
            fVar13 = 1.0 - fVar7 / width;
          }
          fVar10 = projectedTriInterpolate
                             ((Vec3 *)(triS[(long)(int)triWy + -1].m_data + 1),
                              (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar13,local_384);
          fVar11 = projectedTriInterpolate
                             ((Vec3 *)(triT[(long)(int)triWy + -1].m_data + 1),
                              (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar13,local_384);
          fVar12 = projectedTriInterpolate
                             ((Vec3 *)(triR[(long)(int)triWy + -1].m_data + 1),
                              (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar13,local_384);
          tcu::Vector<float,_3>::Vector
                    ((Vector<float,_3> *)(coordDx.m_data + 1),fVar10,fVar11,fVar12);
          fVar10 = triDerivateX((Vec3 *)(triS[(long)(int)triWy + -1].m_data + 1),
                                (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar7,width,
                                local_384);
          fVar11 = triDerivateX((Vec3 *)(triT[(long)(int)triWy + -1].m_data + 1),
                                (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar7,width,
                                local_384);
          fVar12 = triDerivateX((Vec3 *)(triR[(long)(int)triWy + -1].m_data + 1),
                                (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar7,width,
                                local_384);
          tcu::Vector<float,_3>::Vector
                    ((Vector<float,_3> *)(coordDy.m_data + 1),fVar10,fVar11,fVar12);
          fVar10 = triDerivateY((Vec3 *)(triS[(long)(int)triWy + -1].m_data + 1),
                                (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar8,
                                triS[1].m_data[2],fVar13);
          fVar11 = triDerivateY((Vec3 *)(triT[(long)(int)triWy + -1].m_data + 1),
                                (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar8,
                                triS[1].m_data[2],fVar13);
          fVar13 = triDerivateY((Vec3 *)(triR[(long)(int)triWy + -1].m_data + 1),
                                (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar8,
                                triS[1].m_data[2],fVar13);
          tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&lodBounds,fVar10,fVar11,fVar13);
          tcu::computeCubeLodBoundsFromDerivates
                    ((tcu *)&wxo,(Vec3 *)(coordDx.m_data + 1),(Vec3 *)(coordDy.m_data + 1),
                     (Vec3 *)&lodBounds,(int)triS[1].m_data[1],lodPrec);
          for (wyo = 0.0; (int)wyo < 8; wyo = (float)((int)wyo + 1)) {
            fVar13 = tcu::Vector<float,_2>::x(lodOffsets + (long)(int)wyo + -1);
            fVar13 = fVar2 + fVar13;
            fVar10 = tcu::Vector<float,_2>::y(lodOffsets + (long)(int)wyo + -1);
            fVar10 = fVar1 + fVar10;
            fVar11 = fVar13 / width;
            fVar12 = fVar10 / triS[1].m_data[2];
            fVar14 = projectedTriInterpolate
                               ((Vec3 *)(triS[(long)(int)triWy + -1].m_data + 1),
                                (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar11,fVar12);
            fVar15 = projectedTriInterpolate
                               ((Vec3 *)(triT[(long)(int)triWy + -1].m_data + 1),
                                (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar11,fVar12);
            z_ = projectedTriInterpolate
                           ((Vec3 *)(triR[(long)(int)triWy + -1].m_data + 1),
                            (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar11,fVar12);
            tcu::Vector<float,_3>::Vector
                      ((Vector<float,_3> *)(coordDxo.m_data + 1),fVar14,fVar15,z_);
            fVar14 = triDerivateX((Vec3 *)(triS[(long)(int)triWy + -1].m_data + 1),
                                  (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar13,width,
                                  fVar12);
            fVar15 = triDerivateX((Vec3 *)(triT[(long)(int)triWy + -1].m_data + 1),
                                  (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar13,width,
                                  fVar12);
            fVar13 = triDerivateX((Vec3 *)(triR[(long)(int)triWy + -1].m_data + 1),
                                  (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar13,width,
                                  fVar12);
            tcu::Vector<float,_3>::Vector
                      ((Vector<float,_3> *)(coordDyo.m_data + 1),fVar14,fVar15,fVar13);
            fVar13 = triDerivateY((Vec3 *)(triS[(long)(int)triWy + -1].m_data + 1),
                                  (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar10,
                                  triS[1].m_data[2],fVar11);
            fVar12 = triDerivateY((Vec3 *)(triT[(long)(int)triWy + -1].m_data + 1),
                                  (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar10,
                                  triS[1].m_data[2],fVar11);
            fVar10 = triDerivateY((Vec3 *)(triR[(long)(int)triWy + -1].m_data + 1),
                                  (Vec3 *)((long)&lodBias + (long)(int)triWy * 0xc),fVar10,
                                  triS[1].m_data[2],fVar11);
            tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&lodO,fVar13,fVar12,fVar10);
            tcu::computeCubeLodBoundsFromDerivates
                      ((tcu *)&clampedLod,(Vec3 *)(coordDxo.m_data + 1),
                       (Vec3 *)(coordDyo.m_data + 1),(Vec3 *)&lodO,(int)triS[1].m_data[1],lodPrec);
            pfVar6 = tcu::Vector<float,_2>::x((Vector<float,_2> *)&wxo);
            fVar13 = *pfVar6;
            fVar10 = tcu::Vector<float,_2>::x(&clampedLod);
            fVar13 = de::min<float>(fVar13,fVar10);
            pfVar6 = tcu::Vector<float,_2>::x((Vector<float,_2> *)&wxo);
            *pfVar6 = fVar13;
            pfVar6 = tcu::Vector<float,_2>::y((Vector<float,_2> *)&wxo);
            fVar13 = *pfVar6;
            fVar10 = tcu::Vector<float,_2>::y(&clampedLod);
            fVar13 = de::max<float>(fVar13,fVar10);
            pfVar6 = tcu::Vector<float,_2>::y((Vector<float,_2> *)&wxo);
            *pfVar6 = fVar13;
          }
          tcu::operator+((tcu *)&local_31c,(Vector<float,_2> *)&wxo,(Vector<float,_2> *)&numFailed);
          tcu::Vector<float,_2>::Vector(&local_324,sampleParams->minLod,sampleParams->maxLod);
          tcu::clampLodBounds((tcu *)&local_314,&local_31c,&local_324,lodPrec);
          bVar4 = tcu::isLookupResultValid
                            ((TextureCubeView *)local_88,&sampleParams->sampler,lookupPrec,
                             (Vec3 *)(coordDx.m_data + 1),&local_314,(Vec4 *)local_204);
          if (bVar4) {
            bVar3 = true;
            break;
          }
        }
        if (!bVar3) {
          tcu::RGBA::red();
          tcu::RGBA::toVec((RGBA *)&local_334);
          tcu::PixelBufferAccess::setPixel
                    (errorMask,&local_334,(int)resPix.m_data[2],(int)resPix.m_data[3],0);
          lodOffsets[7].m_data[0] = (float)((int)lodOffsets[7].m_data[0] + 1);
        }
      }
    }
    resPix.m_data[3] = (float)((int)resPix.m_data[3] + 1);
  } while( true );
}

Assistant:

int computeTextureLookupDiff (const tcu::ConstPixelBufferAccess&	result,
							  const tcu::ConstPixelBufferAccess&	reference,
							  const tcu::PixelBufferAccess&			errorMask,
							  const tcu::TextureCubeView&			baseView,
							  const float*							texCoord,
							  const ReferenceParams&				sampleParams,
							  const tcu::LookupPrecision&			lookupPrec,
							  const tcu::LodPrecision&				lodPrec,
							  qpWatchDog*							watchDog)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::TextureCubeView					src					= getEffectiveTextureView(getSubView(baseView, sampleParams.baseLevel, sampleParams.maxLevel), srcLevelStorage, sampleParams.sampler);

	const tcu::Vec4								sq					= tcu::Vec4(texCoord[0+0], texCoord[3+0], texCoord[6+0], texCoord[9+0]);
	const tcu::Vec4								tq					= tcu::Vec4(texCoord[0+1], texCoord[3+1], texCoord[6+1], texCoord[9+1]);
	const tcu::Vec4								rq					= tcu::Vec4(texCoord[0+2], texCoord[3+2], texCoord[6+2], texCoord[9+2]);

	const tcu::IVec2							dstSize				= tcu::IVec2(result.getWidth(), result.getHeight());
	const float									dstW				= float(dstSize.x());
	const float									dstH				= float(dstSize.y());
	const int									srcSize				= src.getSize();

	// Coordinates per triangle.
	const tcu::Vec3								triS[2]				= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3								triT[2]				= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3								triR[2]				= { rq.swizzle(0, 1, 2), rq.swizzle(3, 2, 1) };
	const tcu::Vec3								triW[2]				= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2								lodBias				((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	const float									posEps				= 1.0f / float(1<<MIN_SUBPIXEL_BITS);

	int											numFailed			= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),

		// \note Not strictly allowed by spec, but implementations do this in practice.
		tcu::Vec2(-1, -1),
		tcu::Vec2(-1, +1),
		tcu::Vec2(+1, -1),
		tcu::Vec2(+1, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		// Ugly hack, validation can take way too long at the moment.
		if (watchDog)
			qpWatchDog_touch(watchDog);

		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= (result.getPixel(px, py)		- sampleParams.colorBias) / sampleParams.colorScale;
			const tcu::Vec4	refPix	= (reference.getPixel(px, py)	- sampleParams.colorBias) / sampleParams.colorScale;

			// Try comparison to ideal reference first, and if that fails use slower verificator.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(resPix - refPix), lookupPrec.colorThreshold)))
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const bool		tri0	= (wx-posEps)/dstW + (wy-posEps)/dstH <= 1.0f;
				const bool		tri1	= (wx+posEps)/dstW + (wy+posEps)/dstH >= 1.0f;

				bool			isOk	= false;

				DE_ASSERT(tri0 || tri1);

				// Pixel can belong to either of the triangles if it lies close enough to the edge.
				for (int triNdx = (tri0?0:1); triNdx <= (tri1?1:0); triNdx++)
				{
					const float		triWx	= triNdx ? dstW - wx : wx;
					const float		triWy	= triNdx ? dstH - wy : wy;
					const float		triNx	= triNdx ? 1.0f - nx : nx;
					const float		triNy	= triNdx ? 1.0f - ny : ny;

					const tcu::Vec3	coord		(projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy),
												 projectedTriInterpolate(triT[triNdx], triW[triNdx], triNx, triNy),
												 projectedTriInterpolate(triR[triNdx], triW[triNdx], triNx, triNy));
					const tcu::Vec3	coordDx		(triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy),
												 triDerivateX(triT[triNdx], triW[triNdx], wx, dstW, triNy),
												 triDerivateX(triR[triNdx], triW[triNdx], wx, dstW, triNy));
					const tcu::Vec3	coordDy		(triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx),
												 triDerivateY(triT[triNdx], triW[triNdx], wy, dstH, triNx),
												 triDerivateY(triR[triNdx], triW[triNdx], wy, dstH, triNx));

					tcu::Vec2		lodBounds	= tcu::computeCubeLodBoundsFromDerivates(coord, coordDx, coordDy, srcSize, lodPrec);

					// Compute lod bounds across lodOffsets range.
					for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
					{
						const float		wxo		= triWx + lodOffsets[lodOffsNdx].x();
						const float		wyo		= triWy + lodOffsets[lodOffsNdx].y();
						const float		nxo		= wxo/dstW;
						const float		nyo		= wyo/dstH;

						const tcu::Vec3	coordO		(projectedTriInterpolate(triS[triNdx], triW[triNdx], nxo, nyo),
													 projectedTriInterpolate(triT[triNdx], triW[triNdx], nxo, nyo),
													 projectedTriInterpolate(triR[triNdx], triW[triNdx], nxo, nyo));
						const tcu::Vec3	coordDxo	(triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo),
													 triDerivateX(triT[triNdx], triW[triNdx], wxo, dstW, nyo),
													 triDerivateX(triR[triNdx], triW[triNdx], wxo, dstW, nyo));
						const tcu::Vec3	coordDyo	(triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo),
													 triDerivateY(triT[triNdx], triW[triNdx], wyo, dstH, nxo),
													 triDerivateY(triR[triNdx], triW[triNdx], wyo, dstH, nxo));
						const tcu::Vec2	lodO		= tcu::computeCubeLodBoundsFromDerivates(coordO, coordDxo, coordDyo, srcSize, lodPrec);

						lodBounds.x() = de::min(lodBounds.x(), lodO.x());
						lodBounds.y() = de::max(lodBounds.y(), lodO.y());
					}

					const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);

					if (tcu::isLookupResultValid(src, sampleParams.sampler, lookupPrec, coord, clampedLod, resPix))
					{
						isOk = true;
						break;
					}
				}

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}